

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenExpressionRef
BinaryenSIMDShuffle(BinaryenModuleRef module,BinaryenExpressionRef left,BinaryenExpressionRef right,
                   uint8_t *mask_)

{
  undefined8 uVar1;
  undefined8 uVar2;
  SIMDShuffle *this;
  array<unsigned_char,_16UL> mask;
  
  if (mask_ != (uint8_t *)0x0) {
    uVar1 = *(undefined8 *)mask_;
    uVar2 = *(undefined8 *)(mask_ + 8);
    this = (SIMDShuffle *)MixedArena::allocSpace(&module->allocator,0x30,8);
    *(undefined8 *)&(this->super_SpecificExpression<(wasm::Expression::Id)31>).super_Expression = 0;
    (this->super_SpecificExpression<(wasm::Expression::Id)31>).super_Expression.type.id = 0;
    (this->super_SpecificExpression<(wasm::Expression::Id)31>).super_Expression._id = SIMDShuffleId;
    this->left = left;
    this->right = right;
    *(undefined8 *)(this->mask)._M_elems = uVar1;
    *(undefined8 *)((this->mask)._M_elems + 8) = uVar2;
    wasm::SIMDShuffle::finalize(this);
    return (BinaryenExpressionRef)this;
  }
  __assert_fail("mask_",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x5b3,
                "BinaryenExpressionRef BinaryenSIMDShuffle(BinaryenModuleRef, BinaryenExpressionRef, BinaryenExpressionRef, const uint8_t *)"
               );
}

Assistant:

BinaryenExpressionRef BinaryenSIMDShuffle(BinaryenModuleRef module,
                                          BinaryenExpressionRef left,
                                          BinaryenExpressionRef right,
                                          const uint8_t mask_[16]) {
  assert(mask_); // nullptr would be wrong
  std::array<uint8_t, 16> mask;
  memcpy(mask.data(), mask_, 16);
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeSIMDShuffle((Expression*)left, (Expression*)right, mask));
}